

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndp.cpp
# Opt level: O0

Complex __thiscall libDAI::NDP::logZ(NDP *this)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = "NDP::logZ makes no sense?";
  __cxa_throw(puVar1,&char_const*::typeinfo,0);
}

Assistant:

Complex NDP::logZ() const {
        throw("NDP::logZ makes no sense?");
        Complex sum = 0.0;
/*        
        for(size_t i = 0; i < grm().nrVars(); i++ )
            sum += Complex(1.0 - grm().nbV(i).size()) * beliefV(i).entropy();
        for( size_t I = 0; I < grm().nrFactors(); I++ )
            sum -= KL_dist( beliefF(I), grm().factor(I) );
*/            
        return sum;
    }